

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O1

int __thiscall
dynamicgraph::SignalPtr<double,_int>::access(SignalPtr<double,_int> *this,char *__name,int __type)

{
  int iVar1;
  Signal<double,_int> *pSVar2;
  int extraout_EDX;
  
  if (((this->modeNoThrow == true) &&
      (iVar1 = (*this->_vptr_SignalPtr[4])(this), __type = extraout_EDX, (char)iVar1 == '\0')) &&
     ((&this->field_0x50)[(long)this->_vptr_SignalPtr[-3]] == '\x01')) {
    return (int)*(undefined8 *)(&this->field_0x48 + (long)this->_vptr_SignalPtr[-3]);
  }
  pSVar2 = (Signal<double,_int> *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]);
  if (this->signalPtr == pSVar2) {
    iVar1 = Signal<double,_int>::access(pSVar2,__name,__type);
    return iVar1;
  }
  if (this->transmitAbstract == true) {
    (*this->abstractTransmitter->_vptr_SignalBase[0x13])(this->abstractTransmitter,__name);
    return (int)this->transmitAbstractData;
  }
  pSVar2 = getPtr(this);
  iVar1 = (*(pSVar2->super_SignalBase<int>)._vptr_SignalBase[0x1c])(pSVar2,__name);
  return iVar1;
}

Assistant:

const T &SignalPtr<T, Time>::access(const Time &t) {
  dgTDEBUGIN(15);
  if (modeNoThrow && (!isPlugged()) && Signal<T, Time>::copyInit) {
    dgTDEBUGOUT(15);
    return Signal<T, Time>::accessCopy();
  } else if (autoref()) {
    dgTDEBUGOUT(15);
    return Signal<T, Time>::access(t);
  } else if (transmitAbstract) {
    abstractTransmitter->recompute(t);
    dgTDEBUGOUT(15);
    return *transmitAbstractData;
  } else {
    dgTDEBUGOUT(15);
    return getPtr()->access(t);
  }
}